

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR parse_qnames(lysp_yang_ctx *ctx,ly_stmt parent_stmt,lysp_qname **qnames,yang_arg arg,
                   lysp_ext_instance **exts)

{
  uint16_t *flags;
  lysp_qname *plVar1;
  long lVar2;
  ly_stmt stmt;
  LY_ERR LVar3;
  long *plVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 in_register_0000000c;
  ly_ctx *plVar7;
  uint64_t parent_stmt_index;
  bool bVar8;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  ly_stmt local_50;
  ly_stmt local_4c;
  char *local_48;
  size_t local_40;
  char *local_38;
  
  plVar1 = *qnames;
  if (plVar1 == (lysp_qname *)0x0) {
    plVar4 = (long *)malloc(0x20);
    if (plVar4 != (long *)0x0) {
      *plVar4 = 1;
      goto LAB_001755b3;
    }
  }
  else {
    lVar2 = *(long *)&plVar1[-1].flags;
    *(long *)&plVar1[-1].flags = lVar2 + 1;
    plVar4 = (long *)realloc(&plVar1[-1].flags,lVar2 * 0x18 + 0x20);
    if (plVar4 != (long *)0x0) {
LAB_001755b3:
      *qnames = (lysp_qname *)(plVar4 + 1);
      lVar2 = *plVar4;
      flags = (uint16_t *)(plVar4 + lVar2 * 3);
      flags[-8] = 0;
      flags[-7] = 0;
      flags[-6] = 0;
      flags[-5] = 0;
      flags[-4] = 0;
      flags[-3] = 0;
      flags[-2] = 0;
      flags[-1] = 0;
      flags[0] = 0;
      flags[1] = 0;
      flags[2] = 0;
      flags[3] = 0;
      local_4c = parent_stmt;
      LVar3 = get_argument(ctx,Y_STR_ARG,flags,&local_48,&local_38,&local_40);
      if (LVar3 != LY_SUCCESS) {
        return LVar3 + (LVar3 == LY_SUCCESS);
      }
      if (local_38 == (char *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar5 = local_48;
        if (local_40 == 0) {
          pcVar5 = "";
        }
        LVar3 = lydict_insert(plVar7,pcVar5,local_40,(char **)(plVar4 + lVar2 * 3 + -2));
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar3 = lydict_insert_zc(plVar7,local_48,(char **)(plVar4 + lVar2 * 3 + -2));
      }
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      plVar4[lVar2 * 3 + -1] = (long)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
      ;
      LVar3 = get_keyword(ctx,&local_50,&local_48,&local_40);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      if (local_50 == LY_STMT_SYNTAX_SEMICOLON) {
        bVar8 = true;
      }
      else {
        if (local_50 != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar7 = (ly_ctx *)0x0;
          }
          else {
            plVar7 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar5 = lyplg_ext_stmt2str(local_50);
          ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar5);
          return LY_EVALID;
        }
        LVar3 = get_keyword(ctx,&local_50,&local_48,&local_40);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        bVar8 = local_50 == LY_STMT_SYNTAX_RIGHT_BRACE;
      }
      if (!bVar8) {
        do {
          stmt = local_4c;
          if (local_50 != LY_STMT_EXTENSION_INSTANCE) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar7 = (ly_ctx *)0x0;
            }
            else {
              plVar7 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar5 = lyplg_ext_stmt2str(local_50);
            pcVar6 = lyplg_ext_stmt2str(stmt);
            ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar5,pcVar6);
            return LY_EVALID;
          }
          plVar1 = *qnames;
          if (plVar1 == (lysp_qname *)0x0) {
            parent_stmt_index = 0xffffffffffffffff;
          }
          else {
            parent_stmt_index = *(long *)&plVar1[-1].flags - 1;
          }
          LVar3 = parse_ext(ctx,local_48,local_40,plVar1,local_4c,parent_stmt_index,
                            (lysp_ext_instance **)CONCAT44(in_register_0000000c,arg));
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          LVar3 = get_keyword(ctx,&local_50,&local_48,&local_40);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          if (local_50 == LY_STMT_SYNTAX_RIGHT_BRACE) {
            bVar8 = true;
          }
        } while (!bVar8);
      }
      return LY_SUCCESS;
    }
    *(long *)&(*qnames)[-1].flags = *(long *)&(*qnames)[-1].flags + -1;
  }
  if (ctx == (lysp_yang_ctx *)0x0) {
    plVar7 = (ly_ctx *)0x0;
  }
  else {
    plVar7 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_qnames");
  return LY_EMEM;
}

Assistant:

static LY_ERR
parse_qnames(struct lysp_yang_ctx *ctx, enum ly_stmt parent_stmt, struct lysp_qname **qnames, enum yang_arg arg,
        struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    struct lysp_qname *item;
    size_t word_len;
    enum ly_stmt kw;

    /* allocate new pointer */
    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *qnames, item, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, arg, &item->flags, &word, &buf, &word_len));

    INSERT_WORD_GOTO(ctx, buf, item->str, word, word_len, ret, cleanup);
    item->mod = PARSER_CUR_PMOD(ctx);
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, *qnames, parent_stmt, LY_ARRAY_COUNT(*qnames) - 1, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(parent_stmt));
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}